

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[62],kj::StringPtr,char_const(&)[13],kj::StringPtr,char_const(&)[44],kj::Array<kj::StringTree>,char_const(&)[47],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [62],StringPtr *params_1,
          char (*params_2) [13],StringPtr *params_3,char (*params_4) [44],
          Array<kj::StringTree> *params_5,char (*params_6) [47],StringTree *params_7)

{
  char (*value) [62];
  StringPtr *pSVar1;
  char (*value_00) [13];
  char (*value_01) [44];
  Array<kj::StringTree> *this_00;
  char (*value_02) [47];
  StringTree *pSVar2;
  Array<kj::StringTree> *value_03;
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_d0;
  StringTree local_c0;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  char (*params_local_4) [44];
  StringPtr *params_local_3;
  char (*params_local_2) [13];
  StringPtr *params_local_1;
  char (*params_local) [62];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [44])params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [13])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [62])__return_storage_ptr__;
  value = ::const((char (*) [62])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[62]>(value);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::StringPtr>(pSVar1);
  value_00 = ::const((char (*) [13])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[13]>(value_00);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_4);
  local_78 = _::toStringTreeOrCharSequence<kj::StringPtr>(pSVar1);
  value_01 = ::const((char (*) [44])local_38);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[44]>(value_01);
  this_00 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_4);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_c0,(_ *)this_00,value_03);
  value_02 = ::const((char (*) [47])params_5);
  local_d0 = _::toStringTreeOrCharSequence<char_const(&)[47]>(value_02);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_6);
  pSVar2 = _::toStringTreeOrCharSequence(pSVar2);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr___00,(StringTree *)&local_48,&local_58,&local_68,&local_78,
             &local_88,(ArrayPtr<const_char> *)&local_c0,(StringTree *)&local_d0,
             (ArrayPtr<const_char> *)pSVar2,__return_storage_ptr___00);
  StringTree::~StringTree(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}